

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1.c
# Opt level: O3

void t1_dec_clnpass(opj_t1_t *t1,int bpno,int orient,int cblksty)

{
  byte *pbVar1;
  char cVar2;
  opj_mqc_t *mqc;
  opj_mqc_t *poVar3;
  bool bVar4;
  byte bVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  ushort uVar12;
  ulong uVar13;
  ushort uVar14;
  uint oneplushalf;
  int iVar15;
  int iVar16;
  int iVar17;
  flag_t *pfVar18;
  uint uVar19;
  long lVar20;
  uint *datap;
  int *piVar21;
  ushort *puVar22;
  long lVar23;
  flag_t *local_88;
  int *local_80;
  uint local_50;
  uint local_48;
  
  mqc = t1->mqc;
  oneplushalf = (1 << ((byte)bpno & 0x1f)) >> 1 | 1 << (bpno & 0x1fU);
  if ((cblksty & 8U) == 0) {
    local_80 = t1->data;
    local_88 = t1->flags + 1;
    uVar7 = t1->h;
    if ((int)(uVar7 & 0xfffffffc) < 1) {
      uVar13 = (ulong)(uint)t1->w;
      uVar11 = 0;
    }
    else {
      uVar13 = (ulong)(uint)t1->w;
      uVar11 = 0;
      do {
        if (0 < (int)uVar13) {
          local_48 = uVar11 | 2;
          lVar23 = 0;
          do {
            piVar21 = local_80 + lVar23;
            pfVar18 = t1->flags;
            iVar6 = t1->flags_stride;
            lVar20 = lVar23 + 1;
            iVar15 = (int)lVar20;
            if ((((pfVar18[(int)(iVar6 * (uVar11 | 1) + iVar15)] & 0x50ffU) == 0) &&
                ((pfVar18[(int)(iVar6 * local_48 + iVar15)] & 0x50ffU) == 0)) &&
               (((pfVar18[(int)(iVar6 * (uVar11 | 3) + iVar15)] & 0x50ffU) == 0 &&
                ((pfVar18[(int)(iVar6 * (uVar11 + 4) + iVar15)] & 0x50ffU) == 0)))) {
              mqc->curctx = mqc->ctxs + 0x11;
              iVar6 = mqc_decode(mqc);
              if (iVar6 != 0) {
                mqc->curctx = mqc->ctxs + 0x12;
                iVar6 = mqc_decode(mqc);
                uVar7 = mqc_decode(mqc);
                uVar7 = uVar7 | iVar6 * 2;
                if ((int)uVar7 < 4) {
                  datap = (uint *)(piVar21 + (long)t1->w * (long)(int)uVar7);
                  puVar22 = (ushort *)
                            (local_88 + lVar23 + (long)t1->flags_stride * (long)(int)uVar7);
                  iVar6 = 0;
                  do {
                    if (t1->h <= (int)(uVar7 + uVar11 + iVar6)) break;
                    puVar22 = puVar22 + t1->flags_stride;
                    if (iVar6 == 0) {
                      poVar3 = t1->mqc;
                      uVar19 = *puVar22 >> 4 & 0xff;
                      poVar3->curctx =
                           poVar3->ctxs +
                           "\t\n\f\r\n\n\r\r\f\r\f\r\r\r\r\r\t\n\f\v\n\t\r\f\f\v\f\v\r\f\r\f\t\n\f\v\n\n\v\v\f\r\t\n\r\r\n\n\t\n\f\r\n\t\v\f\f\v\t\n\r\f\n\t\t\n\f\r\n\t\v\f\f\r\f\r\v\f\v\f\t\n\f\v\n\n\v\v\f\v\f\v\v\v\v\v\t\n\f\v\n\t\r\f\f\r\t\n\v\f\n\t\t\n\f\r\n\n\r\r\f\v\t\n\v\v\n\n\t\n\f\r\n\n\r\r\f\v\t\n\v\v\n\n\t\n\f\v\n\t\r\f\f\r\t\n\v\f\n\t\t\n\f\v\n\n\v\v\f\v\f\v\v\v\v\v\t\n\f\r\n\t\v\f\f\r\f\r\v\f\v\f\t\n\f\r\n\t\v\f\f\v\t\n\r\f\n\t\t\n\f\v\n\n\v\v\f\r\t\n\r\r\n\n\t\n\f\v\n\t\r\f\f\v\f\v\r\f\r\f\t\n\f\r\n\n\r\r\f\r\f\r\r\r\r\r"
                           [uVar19];
                      uVar8 = mqc_decode(poVar3);
                      cVar2 = ""[uVar19];
                      uVar19 = -oneplushalf;
                      if (uVar8 == (int)cVar2) {
                        uVar19 = oneplushalf;
                      }
                      *datap = uVar19;
                      t1_updateflags((flag_t *)puVar22,uVar8 ^ (int)cVar2,t1->flags_stride);
                      *(byte *)((long)puVar22 + 1) = *(byte *)((long)puVar22 + 1) & 0xbf;
                    }
                    else {
                      t1_dec_clnpass_step(t1,(flag_t *)puVar22,(int *)datap,orient,oneplushalf);
                    }
                    datap = datap + t1->w;
                    iVar15 = uVar7 + uVar11 + iVar6;
                    iVar6 = iVar6 + 1;
                  } while (iVar15 + 1 < (int)(uVar11 + 4));
                }
              }
            }
            else {
              pfVar18 = local_88 + lVar23 + iVar6;
              t1_dec_clnpass_step(t1,pfVar18,piVar21,orient,oneplushalf);
              piVar21 = piVar21 + t1->w;
              pfVar18 = pfVar18 + t1->flags_stride;
              t1_dec_clnpass_step(t1,pfVar18,piVar21,orient,oneplushalf);
              iVar6 = t1->w;
              iVar15 = t1->flags_stride;
              t1_dec_clnpass_step(t1,pfVar18 + iVar15,piVar21 + iVar6,orient,oneplushalf);
              t1_dec_clnpass_step(t1,pfVar18 + iVar15 + t1->flags_stride,piVar21 + iVar6 + t1->w,
                                  orient,oneplushalf);
            }
            uVar13 = (ulong)t1->w;
            lVar23 = lVar20;
          } while (lVar20 < (long)uVar13);
          uVar7 = t1->h;
        }
        uVar11 = uVar11 + 4;
        local_80 = local_80 + (int)uVar13 * 4;
        local_88 = local_88 + (t1->flags_stride << 2);
      } while ((int)uVar11 < (int)(uVar7 & 0xfffffffc));
    }
    if (0 < (int)uVar13) {
      lVar23 = 0;
      do {
        if ((int)uVar11 < (int)uVar7) {
          pfVar18 = local_88 + lVar23;
          piVar21 = local_80 + lVar23;
          uVar19 = uVar11;
          do {
            pfVar18 = pfVar18 + t1->flags_stride;
            t1_dec_clnpass_step(t1,pfVar18,piVar21,orient,oneplushalf);
            uVar13 = (ulong)(uint)t1->w;
            uVar7 = t1->h;
            lVar20 = (long)t1->w;
            piVar21 = piVar21 + lVar20;
            uVar19 = uVar19 + 1;
          } while ((int)uVar19 < (int)uVar7);
        }
        else {
          lVar20 = (long)(int)uVar13;
        }
        lVar23 = lVar23 + 1;
      } while (lVar23 < lVar20);
    }
  }
  else {
    iVar6 = t1->h;
    if (0 < iVar6) {
      iVar15 = t1->w;
      uVar7 = 0;
      do {
        if (0 < iVar15) {
          local_88._0_4_ = uVar7 | 3;
          local_50 = uVar7 | 2;
          iVar6 = 0;
          do {
            bVar5 = 1;
            uVar11 = uVar7;
            if ((int)(uint)local_88 < t1->h) {
              pfVar18 = t1->flags;
              iVar15 = t1->flags_stride;
              if (((((pfVar18[(int)(iVar15 * (uVar7 | 1) + iVar6 + 1)] & 0x50ffU) != 0) ||
                   (iVar16 = iVar6 + 1, (pfVar18[(int)(iVar15 * local_50 + iVar16)] & 0x50ffU) != 0)
                   ) || ((pfVar18[(int)(iVar15 * (uint)local_88 + iVar16)] & 0x50ffU) != 0)) ||
                 ((pfVar18[(int)(iVar15 * (uVar7 + 4) + iVar16)] & 0x50b9U) != 0))
              goto LAB_00209a72;
              mqc->curctx = mqc->ctxs + 0x11;
              iVar15 = mqc_decode(mqc);
              if (iVar15 != 0) {
                mqc->curctx = mqc->ctxs + 0x12;
                iVar15 = mqc_decode(mqc);
                uVar11 = mqc_decode(mqc);
                uVar11 = uVar11 | iVar15 * 2;
                if ((int)uVar11 < 4) {
                  bVar5 = 0;
                  uVar11 = uVar11 + uVar7;
                  goto LAB_00209a72;
                }
              }
            }
            else {
LAB_00209a72:
              iVar15 = 1;
              do {
                uVar19 = uVar11 + 1;
                if (t1->h <= (int)uVar11) break;
                pfVar18 = t1->flags;
                iVar17 = t1->flags_stride * uVar19 + iVar6;
                iVar16 = t1->w;
                puVar22 = (ushort *)(pfVar18 + (long)iVar17 + 1);
                uVar12 = *puVar22;
                uVar14 = uVar12 & 0xfbb9;
                if (uVar11 == t1->h - 1U) {
                  uVar12 = uVar14;
                }
                poVar3 = t1->mqc;
                piVar21 = t1->data;
                if ((-3 - uVar7) + uVar19 == 1) {
                  uVar12 = uVar14;
                }
                if ((bool)(iVar15 != 1 | bVar5)) {
                  if ((uVar12 & 0x5000) == 0) {
                    poVar3->curctx = poVar3->ctxs + ""[(int)(uVar12 & 0xff | orient << 8)];
                    iVar9 = mqc_decode(poVar3);
                    if (iVar9 != 0) goto LAB_00209b49;
                  }
                }
                else {
LAB_00209b49:
                  uVar8 = uVar12 >> 4 & 0xff;
                  poVar3->curctx =
                       poVar3->ctxs +
                       "\t\n\f\r\n\n\r\r\f\r\f\r\r\r\r\r\t\n\f\v\n\t\r\f\f\v\f\v\r\f\r\f\t\n\f\v\n\n\v\v\f\r\t\n\r\r\n\n\t\n\f\r\n\t\v\f\f\v\t\n\r\f\n\t\t\n\f\r\n\t\v\f\f\r\f\r\v\f\v\f\t\n\f\v\n\n\v\v\f\v\f\v\v\v\v\v\t\n\f\v\n\t\r\f\f\r\t\n\v\f\n\t\t\n\f\r\n\n\r\r\f\v\t\n\v\v\n\n\t\n\f\r\n\n\r\r\f\v\t\n\v\v\n\n\t\n\f\v\n\t\r\f\f\r\t\n\v\f\n\t\t\n\f\v\n\n\v\v\f\v\f\v\v\v\v\v\t\n\f\r\n\t\v\f\f\r\f\r\v\f\v\f\t\n\f\r\n\t\v\f\f\v\t\n\r\f\n\t\t\n\f\v\n\n\v\v\f\r\t\n\r\r\n\n\t\n\f\v\n\t\r\f\f\v\f\v\r\f\r\f\t\n\f\r\n\n\r\r\f\r\f\r\r\r\r\r"
                       [uVar8];
                  uVar10 = mqc_decode(poVar3);
                  cVar2 = ""[uVar8];
                  uVar8 = -oneplushalf;
                  if (uVar10 == (int)cVar2) {
                    uVar8 = oneplushalf;
                  }
                  piVar21[(int)(iVar16 * uVar11 + iVar6)] = uVar8;
                  t1_updateflags((flag_t *)puVar22,uVar10 ^ (int)cVar2,t1->flags_stride);
                }
                pbVar1 = (byte *)((long)pfVar18 + (long)iVar17 * 2 + 3);
                *pbVar1 = *pbVar1 & 0xbf;
                iVar15 = iVar15 + 1;
                bVar4 = (int)uVar11 < (int)(uint)local_88;
                uVar11 = uVar19;
              } while (bVar4);
            }
            iVar6 = iVar6 + 1;
            iVar15 = t1->w;
          } while (iVar6 < iVar15);
          iVar6 = t1->h;
        }
        uVar7 = uVar7 + 4;
      } while ((int)uVar7 < iVar6);
    }
  }
  if ((cblksty & 0x20U) != 0) {
    mqc->curctx = mqc->ctxs + 0x12;
    mqc_decode(mqc);
    mqc_decode(mqc);
    mqc_decode(mqc);
    mqc_decode(mqc);
    return;
  }
  return;
}

Assistant:

static void t1_dec_clnpass(
		opj_t1_t *t1,
		int bpno,
		int orient,
		int cblksty)
{
	int i, j, k, one, half, oneplushalf, agg, runlen, vsc;
	int segsym = cblksty & J2K_CCP_CBLKSTY_SEGSYM;
	
	opj_mqc_t *mqc = t1->mqc;	/* MQC component */
	
	one = 1 << bpno;
	half = one >> 1;
	oneplushalf = one | half;
	if (cblksty & J2K_CCP_CBLKSTY_VSC) {
	for (k = 0; k < t1->h; k += 4) {
		for (i = 0; i < t1->w; ++i) {
			if (k + 3 < t1->h) {
					agg = !(MACRO_t1_flags(1 + k,1 + i) & (T1_SIG | T1_VISIT | T1_SIG_OTH)
						|| MACRO_t1_flags(1 + k + 1,1 + i) & (T1_SIG | T1_VISIT | T1_SIG_OTH)
						|| MACRO_t1_flags(1 + k + 2,1 + i) & (T1_SIG | T1_VISIT | T1_SIG_OTH)
						|| (MACRO_t1_flags(1 + k + 3,1 + i) 
						& (~(T1_SIG_S | T1_SIG_SE | T1_SIG_SW |	T1_SGN_S))) & (T1_SIG | T1_VISIT | T1_SIG_OTH));
				} else {
				agg = 0;
			}
			if (agg) {
				mqc_setcurctx(mqc, T1_CTXNO_AGG);
				if (!mqc_decode(mqc)) {
					continue;
				}
				mqc_setcurctx(mqc, T1_CTXNO_UNI);
				runlen = mqc_decode(mqc);
				runlen = (runlen << 1) | mqc_decode(mqc);
			} else {
				runlen = 0;
			}
			for (j = k + runlen; j < k + 4 && j < t1->h; ++j) {
					vsc = (j == k + 3 || j == t1->h - 1) ? 1 : 0;
					t1_dec_clnpass_step_vsc(
						t1,
						&t1->flags[((j+1) * t1->flags_stride) + i + 1],
						&t1->data[(j * t1->w) + i],
						orient,
						oneplushalf,
						agg && (j == k + runlen),
						vsc);
			}
		}
	}
	} else {
		int *data1 = t1->data;
		flag_t *flags1 = &t1->flags[1];
		for (k = 0; k < (t1->h & ~3); k += 4) {
			for (i = 0; i < t1->w; ++i) {
				int *data2 = data1 + i;
				flag_t *flags2 = flags1 + i;
				agg = !(MACRO_t1_flags(1 + k,1 + i) & (T1_SIG | T1_VISIT | T1_SIG_OTH)
					|| MACRO_t1_flags(1 + k + 1,1 + i) & (T1_SIG | T1_VISIT | T1_SIG_OTH)
					|| MACRO_t1_flags(1 + k + 2,1 + i) & (T1_SIG | T1_VISIT | T1_SIG_OTH)
					|| MACRO_t1_flags(1 + k + 3,1 + i) & (T1_SIG | T1_VISIT | T1_SIG_OTH));
				if (agg) {
					mqc_setcurctx(mqc, T1_CTXNO_AGG);
					if (!mqc_decode(mqc)) {
						continue;
					}
					mqc_setcurctx(mqc, T1_CTXNO_UNI);
					runlen = mqc_decode(mqc);
					runlen = (runlen << 1) | mqc_decode(mqc);
					flags2 += runlen * t1->flags_stride;
					data2 += runlen * t1->w;
					for (j = k + runlen; j < k + 4 && j < t1->h; ++j) {
						flags2 += t1->flags_stride;
						if (agg && (j == k + runlen)) {
							t1_dec_clnpass_step_partial(t1, flags2, data2, orient, oneplushalf);
						} else {
							t1_dec_clnpass_step(t1, flags2, data2, orient, oneplushalf);
						}
						data2 += t1->w;
					}
				} else {
					flags2 += t1->flags_stride;
					t1_dec_clnpass_step(t1, flags2, data2, orient, oneplushalf);
					data2 += t1->w;
					flags2 += t1->flags_stride;
					t1_dec_clnpass_step(t1, flags2, data2, orient, oneplushalf);
					data2 += t1->w;
					flags2 += t1->flags_stride;
					t1_dec_clnpass_step(t1, flags2, data2, orient, oneplushalf);
					data2 += t1->w;
					flags2 += t1->flags_stride;
					t1_dec_clnpass_step(t1, flags2, data2, orient, oneplushalf);
					data2 += t1->w;
				}
			}
			data1 += t1->w << 2;
			flags1 += t1->flags_stride << 2;
		}
		for (i = 0; i < t1->w; ++i) {
			int *data2 = data1 + i;
			flag_t *flags2 = flags1 + i;
			for (j = k; j < t1->h; ++j) {
				flags2 += t1->flags_stride;
				t1_dec_clnpass_step(t1, flags2, data2, orient, oneplushalf);
				data2 += t1->w;
			}
		}
	}

	if (segsym) {
		int v = 0;
		mqc_setcurctx(mqc, T1_CTXNO_UNI);
		v = mqc_decode(mqc);
		v = (v << 1) | mqc_decode(mqc);
		v = (v << 1) | mqc_decode(mqc);
		v = (v << 1) | mqc_decode(mqc);
		/*
		if (v!=0xa) {
			opj_event_msg(t1->cinfo, EVT_WARNING, "Bad segmentation symbol %x\n", v);
		} 
		*/
	}
}